

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O3

void __thiscall
libtorrent::fastresume_rejected_alert::~fastresume_rejected_alert(fastresume_rejected_alert *this)

{
  _Atomic_word *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  
  pcVar3 = (this->msg)._M_dataplus._M_p;
  paVar2 = &(this->msg).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar2) {
    operator_delete(pcVar3,paVar2->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->file)._M_dataplus._M_p;
  paVar2 = &(this->file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar2) {
    operator_delete(pcVar3,paVar2->_M_allocated_capacity + 1);
  }
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__torrent_alert_00455758;
  pcVar3 = (this->super_torrent_alert).name._M_dataplus._M_p;
  paVar2 = &(this->super_torrent_alert).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar2) {
    operator_delete(pcVar3,paVar2->_M_allocated_capacity + 1);
  }
  p_Var4 = (this->super_torrent_alert).handle.m_torrent.
           super___weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var4->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var4->_M_weak_count;
      p_Var4->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var4->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

struct TORRENT_EXPORT fastresume_rejected_alert final : torrent_alert
	{
		// internal
		fastresume_rejected_alert(aux::stack_allocator& alloc
			, torrent_handle const& h, error_code const& ec, string_view file
			, operation_t op);

		TORRENT_DEFINE_ALERT_PRIO(fastresume_rejected_alert, 53, alert_priority_critical)

		static constexpr alert_category_t static_category = alert_category::status
			| alert_category::error;
		std::string message() const override;

		error_code error;

		// If the error happened to a specific file, this returns the path to it.
		char const* file_path() const;

		// the underlying operation that failed
		operation_t op;

	private:
		aux::allocation_slot m_path_idx;
#if TORRENT_ABI_VERSION == 1
	public:
		// If the error happened in a disk operation. a 0-terminated string of
		// the name of that operation. ``operation`` is nullptr otherwise.
		char const* TORRENT_DEPRECATED_MEMBER operation;

		// If the error happened to a specific file, ``file`` is the path to it.
		std::string TORRENT_DEPRECATED_MEMBER file;
		std::string TORRENT_DEPRECATED_MEMBER msg;
#endif
	}